

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLinearRangeValid(LookupPrecision *prec,Vec4 *c0,Vec4 *c1,Vec2 *fBounds,Vec4 *result)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  float *pfVar7;
  bool *pbVar8;
  int local_b8;
  bool sMax1;
  bool sMax0;
  bool sMin1;
  bool sMin0;
  int compNdx;
  bool allIntersect;
  Vec4 rMax;
  Vec4 rMin;
  Vector<float,_4> local_80;
  undefined1 local_70 [8];
  Vec4 i1;
  Vector<float,_4> local_50;
  undefined1 local_40 [8];
  Vec4 i0;
  Vec4 *result_local;
  Vec2 *fBounds_local;
  Vec4 *c1_local;
  Vec4 *c0_local;
  LookupPrecision *prec_local;
  
  i0.m_data._8_8_ = result;
  pfVar7 = Vector<float,_2>::operator[](fBounds,0);
  operator*((tcu *)&local_50,c0,1.0 - *pfVar7);
  pfVar7 = Vector<float,_2>::operator[](fBounds,0);
  operator*((tcu *)(i1.m_data + 2),c1,*pfVar7);
  operator+((tcu *)local_40,&local_50,(Vector<float,_4> *)(i1.m_data + 2));
  pfVar7 = Vector<float,_2>::operator[](fBounds,1);
  operator*((tcu *)&local_80,c0,1.0 - *pfVar7);
  pfVar7 = Vector<float,_2>::operator[](fBounds,1);
  operator*((tcu *)(rMin.m_data + 2),c1,*pfVar7);
  operator+((tcu *)local_70,&local_80,(Vector<float,_4> *)(rMin.m_data + 2));
  operator-((tcu *)(rMax.m_data + 2),(Vector<float,_4> *)i0.m_data._8_8_,&prec->colorThreshold);
  operator+((tcu *)&compNdx,(Vector<float,_4> *)i0.m_data._8_8_,&prec->colorThreshold);
  local_b8 = 0;
  do {
    if (3 < local_b8) {
      return true;
    }
    pbVar8 = Vector<bool,_4>::operator[](&prec->colorMask,local_b8);
    if ((*pbVar8 & 1U) != 0) {
      pfVar7 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_40,local_b8);
      fVar1 = *pfVar7;
      pfVar7 = Vector<float,_4>::operator[]((Vector<float,_4> *)(rMax.m_data + 2),local_b8);
      fVar2 = *pfVar7;
      pfVar7 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_70,local_b8);
      fVar3 = *pfVar7;
      pfVar7 = Vector<float,_4>::operator[]((Vector<float,_4> *)(rMax.m_data + 2),local_b8);
      fVar4 = *pfVar7;
      pfVar7 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_40,local_b8);
      fVar5 = *pfVar7;
      pfVar7 = Vector<float,_4>::operator[]((Vector<float,_4> *)&compNdx,local_b8);
      bVar6 = *pfVar7 <= fVar5 && fVar5 != *pfVar7;
      pfVar7 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_70,local_b8);
      fVar5 = *pfVar7;
      pfVar7 = Vector<float,_4>::operator[]((Vector<float,_4> *)&compNdx,local_b8);
      if (((fVar2 <= fVar1 == fVar4 <= fVar3) && (fVar4 <= fVar3 == bVar6)) &&
         (bVar6 == (*pfVar7 <= fVar5 && fVar5 != *pfVar7))) {
        return false;
      }
    }
    local_b8 = local_b8 + 1;
  } while( true );
}

Assistant:

static bool isLinearRangeValid (const LookupPrecision&	prec,
								const Vec4&				c0,
								const Vec4&				c1,
								const Vec2&				fBounds,
								const Vec4&				result)
{
	// This is basically line segment - AABB test. Valid interpolation line is checked
	// against result AABB constructed by applying threshold.

	const Vec4		i0				= c0*(1.0f - fBounds[0]) + c1*fBounds[0];
	const Vec4		i1				= c0*(1.0f - fBounds[1]) + c1*fBounds[1];
	const Vec4		rMin			= result - prec.colorThreshold;
	const Vec4		rMax			= result + prec.colorThreshold;
	bool			allIntersect	= true;

	// Algorithm: For each component check whether segment endpoints are inside, or intersect with slab.
	// If all intersect or are inside, line segment intersects the whole 4D AABB.
	for (int compNdx = 0; compNdx < 4; compNdx++)
	{
		if (!prec.colorMask[compNdx])
			continue;

		// Signs for both bounds: false = left, true = right.
		const bool	sMin0	= i0[compNdx] >= rMin[compNdx];
		const bool	sMin1	= i1[compNdx] >= rMin[compNdx];
		const bool	sMax0	= i0[compNdx] > rMax[compNdx];
		const bool	sMax1	= i1[compNdx] > rMax[compNdx];

		// If all signs are equal, line segment is outside bounds.
		if (sMin0 == sMin1 && sMin1 == sMax0 && sMax0 == sMax1)
		{
			allIntersect = false;
			break;
		}
	}

	return allIntersect;
}